

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int direct_declarator(sym_t *s)

{
  int iVar1;
  socklen_t *extraout_RDX;
  socklen_t *__addr_len;
  socklen_t *extraout_RDX_00;
  socklen_t *extraout_RDX_01;
  socklen_t *extraout_RDX_02;
  socklen_t *extraout_RDX_03;
  char *__addr;
  char *in_RDI;
  int unaff_retaddr;
  int local_4;
  
  if (t->id == 0x86) {
    __addr = t->string;
    strcpy(in_RDI,__addr);
    next();
    __addr_len = extraout_RDX;
    while (t->id == 0x28) {
      iVar1 = accept(0x28,(sockaddr *)__addr,__addr_len);
      __addr_len = extraout_RDX_00;
      if (iVar1 != 0) {
        if (*(int *)(in_RDI + 0x24) == 0) {
          in_RDI[0x24] = '\x01';
          in_RDI[0x25] = '\0';
          in_RDI[0x26] = '\0';
          in_RDI[0x27] = '\0';
          iVar1 = expect(unaff_retaddr);
          __addr_len = extraout_RDX_02;
          if (iVar1 == 0) {
            sync();
            __addr_len = extraout_RDX_03;
          }
        }
        else {
          __addr = "\'%s\' declared as a function returning a function";
          err(E,"\'%s\' declared as a function returning a function",in_RDI);
          sync();
          __addr_len = extraout_RDX_01;
        }
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int direct_declarator(sym_t* s)
{
    if (t->id == IDENTIFIER)
    {
        strcpy(s->id, t->string);
        next();

        while (/* t->id == '[' || */ t->id == '(' )
        {
            /* if (t->id == '[')
            {
            }
            else */ if (accept('('))
            {

                if (s->function)
                {
                    err(E, "'%s' declared as a function returning a function", s->id);
                    sync(")");
                }
                else
                {
                    s->function = 1;
                    if (expect(')'))
                        ;
                    else
                        sync(")");
                }
            }

        }

        return 1;
    }
    /*
    else if (t->id == '(')
    {
        declarator etc
        if (t->id == '['
    }

    */
    return 0;
}